

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_verify(secp256k1_context *ctx,secp256k1_ge *group)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  secp256k1_scalar check_x_s;
  uchar msg32 [32];
  int should_verify;
  int k;
  secp256k1_scalar msg_plus_r_times_sk_s;
  secp256k1_scalar s_times_k_s;
  secp256k1_scalar s_s;
  secp256k1_scalar r_s;
  secp256k1_scalar msg_s;
  secp256k1_scalar sk_s;
  secp256k1_pubkey pk;
  secp256k1_ecdsa_signature sig;
  secp256k1_ge nonconst_ge;
  uint64_t iter;
  int key;
  int msg;
  int r;
  int s;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  uint local_130;
  int local_12c;
  int local_11c;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef4;
  secp256k1_ge *in_stack_fffffffffffffef8;
  secp256k1_scalar *in_stack_ffffffffffffff00;
  secp256k1_pubkey *in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff18;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  undefined1 local_90 [104];
  uint64_t local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_28 = 0;
  local_14 = 1;
  local_10 = in_RSI;
  do {
    if (0xc < local_14) {
      return;
    }
    for (local_18 = 1; local_18 < 0xd; local_18 = local_18 + 1) {
      for (local_1c = 1; local_1c < 0xd; local_1c = local_1c + 1) {
        for (local_20 = 1; local_20 < 0xd; local_20 = local_20 + 1) {
          iVar1 = skip_section(&local_28);
          if (iVar1 == 0) {
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c);
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c);
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c);
            secp256k1_scalar_set_int
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c);
            local_130 = 0;
            for (local_12c = 0; local_12c < 0xd; local_12c = local_12c + 1) {
              r_from_k(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4
                       ,(int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
              if (local_11c == in_stack_fffffffffffffea4) {
                secp256k1_scalar_set_int
                          ((secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           in_stack_fffffffffffffe9c);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           (secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (secp256k1_scalar *)0x111de1);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           (secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (secp256k1_scalar *)0x111df5);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           (secp256k1_scalar *)
                           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (secp256k1_scalar *)0x111e07);
                uVar2 = secp256k1_scalar_eq((secp256k1_scalar *)
                                            CONCAT44(in_stack_fffffffffffffea4,
                                                     in_stack_fffffffffffffea0),
                                            (secp256k1_scalar *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
                local_130 = uVar2 | local_130;
              }
            }
            iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)0x111e3a);
            local_130 = ((iVar1 != 0 ^ 0xffU) & 1) & local_130;
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (secp256k1_scalar *)0x111e66);
            memcpy(local_90,(void *)(local_10 + (ulong)in_stack_fffffffffffffeec * 0x68),0x68);
            secp256k1_pubkey_save
                      ((secp256k1_pubkey *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                      );
            secp256k1_scalar_get_b32
                      ((uchar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (secp256k1_scalar *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
            uVar2 = secp256k1_ecdsa_verify
                              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            in_stack_fffffffffffffea0 = local_130;
            if (local_130 != uVar2) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests_exhaustive.c"
                      ,0x11a,
                      "test condition failed: should_verify == secp256k1_ecdsa_verify(ctx, &sig, msg32, &pk)"
                     );
              abort();
            }
          }
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static void test_exhaustive_verify(const secp256k1_context *ctx, const secp256k1_ge *group) {
    int s, r, msg, key;
    uint64_t iter = 0;
    for (s = 1; s < EXHAUSTIVE_TEST_ORDER; s++) {
        for (r = 1; r < EXHAUSTIVE_TEST_ORDER; r++) {
            for (msg = 1; msg < EXHAUSTIVE_TEST_ORDER; msg++) {
                for (key = 1; key < EXHAUSTIVE_TEST_ORDER; key++) {
                    secp256k1_ge nonconst_ge;
                    secp256k1_ecdsa_signature sig;
                    secp256k1_pubkey pk;
                    secp256k1_scalar sk_s, msg_s, r_s, s_s;
                    secp256k1_scalar s_times_k_s, msg_plus_r_times_sk_s;
                    int k, should_verify;
                    unsigned char msg32[32];

                    if (skip_section(&iter)) continue;

                    secp256k1_scalar_set_int(&s_s, s);
                    secp256k1_scalar_set_int(&r_s, r);
                    secp256k1_scalar_set_int(&msg_s, msg);
                    secp256k1_scalar_set_int(&sk_s, key);

                    /* Verify by hand */
                    /* Run through every k value that gives us this r and check that *one* works.
                     * Note there could be none, there could be multiple, ECDSA is weird. */
                    should_verify = 0;
                    for (k = 0; k < EXHAUSTIVE_TEST_ORDER; k++) {
                        secp256k1_scalar check_x_s;
                        r_from_k(&check_x_s, group, k, NULL);
                        if (r_s == check_x_s) {
                            secp256k1_scalar_set_int(&s_times_k_s, k);
                            secp256k1_scalar_mul(&s_times_k_s, &s_times_k_s, &s_s);
                            secp256k1_scalar_mul(&msg_plus_r_times_sk_s, &r_s, &sk_s);
                            secp256k1_scalar_add(&msg_plus_r_times_sk_s, &msg_plus_r_times_sk_s, &msg_s);
                            should_verify |= secp256k1_scalar_eq(&s_times_k_s, &msg_plus_r_times_sk_s);
                        }
                    }
                    /* nb we have a "high s" rule */
                    should_verify &= !secp256k1_scalar_is_high(&s_s);

                    /* Verify by calling verify */
                    secp256k1_ecdsa_signature_save(&sig, &r_s, &s_s);
                    memcpy(&nonconst_ge, &group[sk_s], sizeof(nonconst_ge));
                    secp256k1_pubkey_save(&pk, &nonconst_ge);
                    secp256k1_scalar_get_b32(msg32, &msg_s);
                    CHECK(should_verify ==
                          secp256k1_ecdsa_verify(ctx, &sig, msg32, &pk));
                }
            }
        }
    }
}